

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_AEAD.c
# Opt level: O3

EverCrypt_Error_error_code
EverCrypt_AEAD_decrypt
          (EverCrypt_AEAD_state_s *s,uint8_t *iv,uint32_t iv_len,uint8_t *ad,uint32_t ad_len,
          uint8_t *cipher,uint32_t cipher_len,uint8_t *tag,uint8_t *dst)

{
  Spec_Cipher_Expansion_impl SVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  EverCrypt_Error_error_code EVar4;
  uint32_t uVar5;
  uint uVar6;
  uint64_t len128x6_;
  long lVar7;
  uint extraout_EDX;
  ulong uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 auStack_2a0 [176];
  undefined1 auStack_1f0 [128];
  undefined1 auStack_170 [16];
  undefined1 auStack_160 [16];
  undefined1 auStack_150 [96];
  undefined8 uStack_f0;
  uint8_t *puStack_e8;
  uint8_t *puStack_e0;
  uint8_t *puStack_d8;
  ulong uStack_d0;
  uint8_t *puStack_c8;
  uint8_t *puStack_c0;
  uint local_80;
  undefined8 local_78;
  long local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  uint8_t *local_40;
  ulong local_38;
  
  if (s == (EverCrypt_AEAD_state_s *)0x0) {
    return '\x02';
  }
  SVar1 = s->impl;
  if (SVar1 == '\0') {
    if (iv_len == 0xc) {
      uVar5 = EverCrypt_Chacha20Poly1305_aead_decrypt(s->ek,iv,ad_len,ad,cipher_len,dst,cipher,tag);
      return (uVar5 != 0) * '\x03';
    }
    return '\x04';
  }
  puStack_e0 = cipher;
  puStack_c8 = cipher;
  local_40 = ad;
  if (SVar1 == '\x02') {
    if (iv_len == 0) {
      return '\x04';
    }
    puVar2 = s->ek;
    puVar10 = puVar2 + 0x170;
    local_58 = 0;
    uStack_50 = 0;
    memcpy(&local_58,iv + (iv_len & 0xfffffff0),(ulong)(iv_len & 0xf));
    compute_iv_stdcall(iv,iv_len,iv_len >> 4,&local_58,&local_58,puVar2 + 0xf0);
    puVar3 = local_40;
    local_48 = (ulong)(cipher_len & 0xfffffff0);
    local_38 = (ulong)(cipher_len & 0xf);
    memcpy(puVar10,cipher + local_48,local_38);
    memcpy(puVar2 + 0x180,puVar3 + (ad_len & 0xfffffff0),(ulong)(ad_len & 0xf));
    uVar6 = (cipher_len / 0x60) * 0x60;
    if (uVar6 < 0x60) {
      puStack_c0 = dst;
      uStack_d0 = 0;
    }
    else {
      uStack_d0 = (ulong)(uVar6 >> 4);
      puStack_c8 = cipher + uVar6;
      puStack_c0 = dst + uVar6;
    }
    puStack_d8 = dst;
    uStack_f0 = 0x1784cc;
    puStack_e8 = puVar2 + 0x180;
    lVar7 = gcm256_decrypt_opt(puVar3,ad_len,ad_len >> 4,puVar2,&local_58,puVar2 + 0xf0);
  }
  else {
    if (SVar1 != '\x01') {
      EverCrypt_AEAD_decrypt_cold_1();
      memset(auStack_2a0,0,0x1e0);
      aes128_key_expansion(s,auStack_2a0);
      aes128_keyhash_init(auStack_2a0,auStack_1f0);
      if (extraout_EDX == 0) {
        EVar4 = '\x04';
      }
      else {
        uStack_2b0 = 0;
        uStack_2a8 = 0;
        memcpy(&uStack_2b0,iv + (extraout_EDX & 0xfffffff0),(ulong)(extraout_EDX & 0xf));
        compute_iv_stdcall(iv,extraout_EDX,extraout_EDX >> 4,&uStack_2b0,&uStack_2b0,auStack_1f0);
        memcpy(auStack_170,dst + (local_80 & 0xfffffff0),(ulong)(local_80 & 0xf));
        memcpy(auStack_160,ad + (ad_len & 0xfffffff0),(ulong)(ad_len & 0xf));
        uVar6 = (local_80 / 0x60) * 0x60;
        if (uVar6 < 0x60) {
          uVar9 = (ulong)(local_80 >> 4);
          uVar6 = 0;
          puVar10 = dst;
          lVar7 = local_70;
        }
        else {
          uVar8 = (ulong)uVar6;
          uVar6 = uVar6 >> 4;
          uVar9 = (local_80 & 0xfffffff0) - uVar8 >> 4;
          puVar10 = dst + uVar8;
          lVar7 = uVar8 + local_70;
        }
        lVar7 = gcm128_decrypt_opt(ad,ad_len,ad_len >> 4,auStack_2a0,&uStack_2b0,auStack_1f0,
                                   auStack_160,dst,local_70,uVar6,puVar10,lVar7,uVar9,auStack_170,
                                   local_80,auStack_150,local_78);
        memcpy((void *)(local_70 + (ulong)(local_80 & 0xfffffff0)),auStack_170,
               (ulong)(local_80 & 0xf));
        EVar4 = (lVar7 != 0) * '\x03';
      }
      return EVar4;
    }
    if (iv_len == 0) {
      return '\x04';
    }
    puVar2 = s->ek;
    puVar10 = puVar2 + 0x130;
    local_58 = 0;
    uStack_50 = 0;
    memcpy(&local_58,iv + (iv_len & 0xfffffff0),(ulong)(iv_len & 0xf));
    compute_iv_stdcall(iv,iv_len,iv_len >> 4,&local_58,&local_58,puVar2 + 0xb0);
    puVar3 = local_40;
    local_48 = (ulong)(cipher_len & 0xfffffff0);
    local_38 = (ulong)(cipher_len & 0xf);
    memcpy(puVar10,cipher + local_48,local_38);
    memcpy(puVar2 + 0x140,puVar3 + (ad_len & 0xfffffff0),(ulong)(ad_len & 0xf));
    uVar6 = (cipher_len / 0x60) * 0x60;
    if (uVar6 < 0x60) {
      puStack_c0 = dst;
      uStack_d0 = 0;
    }
    else {
      uStack_d0 = (ulong)(uVar6 >> 4);
      puStack_c8 = cipher + uVar6;
      puStack_c0 = dst + uVar6;
    }
    puStack_d8 = dst;
    uStack_f0 = 0x178529;
    puStack_e8 = puVar2 + 0x140;
    lVar7 = gcm128_decrypt_opt(puVar3,ad_len,ad_len >> 4,puVar2,&local_58,puVar2 + 0xb0);
  }
  memcpy(dst + local_48,puVar10,local_38);
  return (lVar7 != 0) * '\x03';
}

Assistant:

EverCrypt_Error_error_code
EverCrypt_AEAD_decrypt(
  EverCrypt_AEAD_state_s *s,
  uint8_t *iv,
  uint32_t iv_len,
  uint8_t *ad,
  uint32_t ad_len,
  uint8_t *cipher,
  uint32_t cipher_len,
  uint8_t *tag,
  uint8_t *dst
)
{
  if (s == NULL)
  {
    return EverCrypt_Error_InvalidKey;
  }
  Spec_Cipher_Expansion_impl i = (*s).impl;
  switch (i)
  {
    case Spec_Cipher_Expansion_Vale_AES128:
      {
        return decrypt_aes128_gcm(s, iv, iv_len, ad, ad_len, cipher, cipher_len, tag, dst);
      }
    case Spec_Cipher_Expansion_Vale_AES256:
      {
        return decrypt_aes256_gcm(s, iv, iv_len, ad, ad_len, cipher, cipher_len, tag, dst);
      }
    case Spec_Cipher_Expansion_Hacl_CHACHA20:
      {
        return decrypt_chacha20_poly1305(s, iv, iv_len, ad, ad_len, cipher, cipher_len, tag, dst);
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}